

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode expect100(Curl_easy *data,connectdata *conn,Curl_send_buffer *req_buffer)

{
  long lVar1;
  _Bool _Var2;
  CURLcode CVar3;
  char *headerline;
  Curl_send_buffer *local_10;
  
  (data->state).expect100header = false;
  if (((((data->state).httpversion != 10) && (conn->httpversion != 10)) &&
      (lVar1 = (data->set).httpversion, 10 < conn->httpversion || lVar1 != 1)) &&
     ((lVar1 == 0 || 1 < lVar1 && (conn->httpversion != 0x14)))) {
    local_10 = req_buffer;
    headerline = Curl_checkheaders(conn,"Expect");
    if (headerline == (char *)0x0) {
      CVar3 = Curl_add_bufferf(&local_10,"Expect: 100-continue\r\n");
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      _Var2 = true;
    }
    else {
      _Var2 = Curl_compareheader(headerline,"Expect:","100-continue");
    }
    (data->state).expect100header = _Var2;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode expect100(struct Curl_easy *data,
                          struct connectdata *conn,
                          Curl_send_buffer *req_buffer)
{
  CURLcode result = CURLE_OK;
  data->state.expect100header = FALSE; /* default to false unless it is set
                                          to TRUE below */
  if(use_http_1_1plus(data, conn) &&
     (conn->httpversion != 20)) {
    /* if not doing HTTP 1.0 or version 2, or disabled explicitly, we add an
       Expect: 100-continue to the headers which actually speeds up post
       operations (as there is one packet coming back from the web server) */
    const char *ptr = Curl_checkheaders(conn, "Expect");
    if(ptr) {
      data->state.expect100header =
        Curl_compareheader(ptr, "Expect:", "100-continue");
    }
    else {
      result = Curl_add_bufferf(&req_buffer,
                                "Expect: 100-continue\r\n");
      if(!result)
        data->state.expect100header = TRUE;
    }
  }

  return result;
}